

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O3

int __thiscall embree::FastAllocator::unshare(FastAllocator *this,int __flags)

{
  long lVar1;
  void *ptr;
  undefined4 in_register_00000034;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)CONCAT44(in_register_00000034,__flags);
  reset(this);
  lVar1 = puVar2[3];
  ptr = (void *)puVar2[4];
  if (ptr != (void *)0x0) {
    if ((ulong)(lVar1 << 5) < 0x1c00000) {
      alignedFree(ptr);
    }
    else {
      os_free(ptr,lVar1 << 5,*(bool *)(puVar2 + 1));
    }
  }
  if (lVar1 != 0) {
    (*(code *)**(undefined8 **)*puVar2)((undefined8 *)*puVar2,lVar1 * -0x20,1);
  }
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  *puVar2 = (this->primrefarray).alloc.device;
  *(bool *)(puVar2 + 1) = (this->primrefarray).alloc.hugepages;
  puVar2[2] = (this->primrefarray).size_active;
  (this->primrefarray).size_active = 0;
  puVar2[3] = (this->primrefarray).size_alloced;
  (this->primrefarray).size_alloced = 0;
  puVar2[4] = (this->primrefarray).items;
  (this->primrefarray).items = (PrimRef *)0x0;
  return 0;
}

Assistant:

void unshare(mvector<PrimRef>& primrefarray_o)
    {
      reset(); // this removes blocks that are allocated inside the shared primref array
      primrefarray_o = std::move(primrefarray);
    }